

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

void __thiscall luna::VM::GenerateClosure(VM *this,Value *a,Instruction i)

{
  bool bVar1;
  reference pvVar2;
  Function *this_00;
  Function *prototype;
  Closure *pCVar3;
  size_t sVar4;
  UpvalueInfo *pUVar5;
  Value *value;
  Upvalue *this_01;
  Instruction in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  Upvalue *upvalue_1;
  Upvalue *upvalue;
  Value *reg;
  UpvalueInfo *upvalue_info;
  size_t i_1;
  size_t count;
  Closure *closure;
  Closure *new_closure;
  Function *a_proto;
  Function *proto;
  value_type *call;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *in_stack_ffffffffffffff70;
  ulong local_58;
  
  bVar1 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::empty
                    ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)(*in_RDI + 0x48));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!state_->calls_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                  0x152,"void luna::VM::GenerateClosure(Value *, Instruction)");
  }
  pvVar2 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::back
                     (in_stack_ffffffffffffff70);
  bVar1 = false;
  if (pvVar2->func_ != (Value *)0x0) {
    bVar1 = (pvVar2->func_->field_0).obj_ != (GCObject *)0x0;
  }
  if (bVar1) {
    this_00 = Closure::GetPrototype((pvVar2->func_->field_0).closure_);
    Instruction::GetParamBx(in_EDX);
    prototype = Function::GetChildFunction(this_00,in_stack_ffffffffffffff6c);
    *(undefined4 *)(in_RSI + 1) = 5;
    pCVar3 = State::NewClosure((State *)0x175f3b);
    *in_RSI = pCVar3;
    Closure::SetPrototype((Closure *)*in_RSI,prototype);
    sVar4 = Function::GetUpvalueCount((Function *)0x175f89);
    for (local_58 = 0; local_58 < sVar4; local_58 = local_58 + 1) {
      pUVar5 = Function::GetUpvalue
                         (this_00,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if ((pUVar5->parent_local_ & 1U) == 0) {
        Closure::GetUpvalue((Closure *)this_00,
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        Closure::AddUpvalue((Closure *)this_00,
                            (Upvalue *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                           );
      }
      else {
        value = pvVar2->register_ + pUVar5->register_index_;
        if (value->type_ == ValueT_Upvalue) {
          Closure::AddUpvalue((Closure *)this_00,
                              (Upvalue *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
        else {
          this_01 = State::NewUpvalue((State *)0x175fff);
          Upvalue::SetValue(this_01,value);
          value->type_ = ValueT_Upvalue;
          (value->field_0).upvalue_ = this_01;
          Closure::AddUpvalue((Closure *)this_00,
                              (Upvalue *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        }
      }
    }
    return;
  }
  __assert_fail("call->func_ && call->func_->closure_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x152,"void luna::VM::GenerateClosure(Value *, Instruction)");
}

Assistant:

void VM::GenerateClosure(Value *a, Instruction i)
    {
        GET_CALLINFO_AND_PROTO();
        auto a_proto = proto->GetChildFunction(Instruction::GetParamBx(i));
        a->type_ = ValueT_Closure;
        a->closure_ = state_->NewClosure();
        a->closure_->SetPrototype(a_proto);

        // Prepare all upvalues
        auto new_closure = a->closure_;
        auto closure = call->func_->closure_;
        auto count = a_proto->GetUpvalueCount();
        for (std::size_t i = 0; i < count; ++i)
        {
            auto upvalue_info = a_proto->GetUpvalue(i);
            if (upvalue_info->parent_local_)
            {
                // Transform local variable to upvalue
                auto reg = call->register_ + upvalue_info->register_index_;
                if (reg->type_ != ValueT_Upvalue)
                {
                    auto upvalue = state_->NewUpvalue();
                    upvalue->SetValue(*reg);
                    reg->type_ = ValueT_Upvalue;
                    reg->upvalue_ = upvalue;
                    new_closure->AddUpvalue(upvalue);
                }
                else
                {
                    new_closure->AddUpvalue(reg->upvalue_);
                }
            }
            else
            {
                // Get upvalue from parent upvalue list
                auto upvalue = closure->GetUpvalue(upvalue_info->register_index_);
                new_closure->AddUpvalue(upvalue);
            }
        }
    }